

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int compound_statement(void)

{
  int iVar1;
  uint uVar2;
  int extraout_EAX;
  char *pcVar3;
  socklen_t *in_RDX;
  socklen_t *__addr_len;
  sockaddr *in_RSI;
  
  iVar1 = accept(0x7b,in_RSI,in_RDX);
  if (iVar1 == 0) {
    return 0;
  }
  iVar1 = syms_inc_scope();
  ast_inc_scope(iVar1);
  iVar1 = accept(0x7d,in_RSI,__addr_len);
  if (iVar1 != 0) goto LAB_001059f8;
  uVar2 = t->id - 0x80;
  if ((uVar2 < 6) && ((0x31U >> (uVar2 & 0x1f) & 1) != 0)) {
    do {
      declaration();
      uVar2 = t->id - 0x80;
      if (5 < uVar2) break;
    } while ((0x31U >> (uVar2 & 0x1f) & 1) != 0);
    statement_list();
LAB_001059ae:
    iVar1 = expect(0x7d);
    if (iVar1 != 0) goto LAB_001059f8;
  }
  else {
    iVar1 = statement_list();
    if (iVar1 != 0) goto LAB_001059ae;
    pcVar3 = token_name(last_id);
    err(E,"expected \'}\' or statement after %s",pcVar3);
  }
  sync();
  if (extraout_EAX == 0) {
    return 1;
  }
LAB_001059f8:
  ast_dec_scope();
  syms_dec_scope();
  return 1;
}

Assistant:

int compound_statement()
{
    if (accept('{'))
    {
        ast_inc_scope(syms_inc_scope());

        if (accept('}'))
        {
            ast_dec_scope();
            syms_dec_scope();
            return 1;
        }
        else if (declaration_list())
        {
            if (statement_list())
            {
                if (expect('}'))
                {
                    ast_dec_scope();
                    syms_dec_scope();
                    return 1;
                }
            }
            else if (expect('}'))
            {
                ast_dec_scope();
                syms_dec_scope();
                return 1;
            }
        }
        else if (statement_list())
        {
            if (expect('}'))
            {
                ast_dec_scope();
                syms_dec_scope();
                return 1;
            }
        }
        else
        {
            err(E, "expected '}' or statement after %s", token_name(last_id));
        }


        if (sync("}"))
        {
            ast_dec_scope();
            syms_dec_scope();
        }

        return 1;
    }
    return 0;
}